

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O0

void __thiscall ItemWrapper::ItemWrapper(ItemWrapper *this,Item *item,itemLocation l)

{
  Item local_50;
  itemLocation local_1c;
  Item *pIStack_18;
  itemLocation l_local;
  Item *item_local;
  ItemWrapper *this_local;
  
  local_1c = l;
  pIStack_18 = item;
  item_local = &this->classItem;
  Item::Item(&this->classItem,item);
  this->location = local_1c;
  Action::Action(&this->defaultAction,NO_ACTION);
  this->state = DEFAULT;
  std::__cxx11::string::string((string *)&this->itemName);
  Item::getName_abi_cxx11_(&local_50);
  setItemName(this,&local_50.name);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

ItemWrapper::ItemWrapper(Item item, itemLocation l) : classItem(item), location(l),
defaultAction(Action(NO_ACTION)), state(DEFAULT){
    setItemName(item.getName());
}